

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

FILE * __thiscall fmt::File::fdopen(File *this,int __fd,char *__modes)

{
  FILE *pFVar1;
  SystemError *this_00;
  int *piVar2;
  undefined4 in_register_00000034;
  
  pFVar1 = ::fdopen(*(int *)CONCAT44(in_register_00000034,__fd),__modes);
  if (pFVar1 != (FILE *)0x0) {
    *(FILE **)this = pFVar1;
    *(int *)CONCAT44(in_register_00000034,__fd) = -1;
    return (FILE *)this;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError(this_00,*piVar2,(CStringRef)0x27c8f1);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

fmt::BufferedFile fmt::File::fdopen(const char *mode) {
  // Don't retry as fdopen doesn't return EINTR.
  FILE *f = FMT_POSIX_CALL(fdopen(fd_, mode));
  if (!f)
    FMT_THROW(SystemError(errno, "cannot associate stream with file descriptor"));
  BufferedFile file(f);
  fd_ = -1;
  return file;
}